

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

double Catch::Benchmark::Detail::outlier_variance
                 (Estimate<double> mean,Estimate<double> stddev,int n)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar10;
  undefined1 auVar9 [16];
  double dVar11;
  double k;
  double dVar12;
  
  dVar6 = (double)n;
  dVar12 = mean.point / dVar6;
  dVar7 = dVar12 * 0.5 * 0.25;
  if (dVar6 < 0.0) {
    dVar3 = sqrt(dVar6);
  }
  else {
    dVar3 = SQRT(dVar6);
  }
  dVar5 = stddev.point / dVar3;
  if (dVar7 <= stddev.point / dVar3) {
    dVar5 = dVar7;
  }
  dVar5 = dVar5 * dVar5;
  dVar3 = stddev.point * stddev.point;
  dVar11 = dVar3 - dVar6 * dVar5;
  dVar7 = dVar12 - dVar12 * 0.5;
  dVar7 = dVar7 * dVar7 * dVar6;
  dVar12 = dVar12 * dVar12 * dVar6;
  dVar8 = (double)-n * dVar7;
  dVar10 = (double)-n * dVar12;
  dVar7 = dVar11 + dVar7;
  dVar11 = dVar11 + dVar12;
  dVar12 = dVar11 * dVar11 + dVar10 * dVar5 * -4.0;
  if (dVar12 < 0.0) {
    dVar12 = sqrt(dVar12);
  }
  else {
    dVar12 = SQRT(dVar12);
  }
  auVar9._0_8_ = dVar8 * -2.0;
  auVar9._8_8_ = dVar10 * -2.0;
  dVar8 = dVar7 * dVar7 + dVar5 * -4.0 * dVar8;
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  auVar1._8_4_ = SUB84(dVar12 + dVar11,0);
  auVar1._0_8_ = dVar8 + dVar7;
  auVar1._12_4_ = (int)((ulong)(dVar12 + dVar11) >> 0x20);
  auVar9 = divpd(auVar9,auVar1);
  dVar7 = (double)(int)auVar9._0_8_;
  if ((double)(int)auVar9._8_8_ <= (double)(int)auVar9._0_8_) {
    dVar7 = (double)(int)auVar9._8_8_;
  }
  auVar4._8_8_ = dVar6 + -1.0;
  auVar4._0_8_ = dVar6 - dVar7;
  auVar2._8_8_ = dVar6;
  auVar2._0_8_ = dVar6;
  auVar9 = divpd(auVar4,auVar2);
  dVar7 = (dVar3 - dVar5 * (dVar6 - dVar7)) * auVar9._0_8_;
  dVar6 = (dVar3 - dVar5 * (dVar6 + -1.0)) * auVar9._8_8_;
  if (dVar6 <= dVar7) {
    dVar7 = dVar6;
  }
  return dVar7 / dVar3;
}

Assistant:

double outlier_variance(Estimate<double> mean, Estimate<double> stddev, int n) {
                double sb = stddev.point;
                double mn = mean.point / n;
                double mg_min = mn / 2.;
                double sg = (std::min)(mg_min / 4., sb / std::sqrt(n));
                double sg2 = sg * sg;
                double sb2 = sb * sb;

                auto c_max = [n, mn, sb2, sg2](double x) -> double {
                    double k = mn - x;
                    double d = k * k;
                    double nd = n * d;
                    double k0 = -n * nd;
                    double k1 = sb2 - n * sg2 + nd;
                    double det = k1 * k1 - 4 * sg2 * k0;
                    return (int)(-2. * k0 / (k1 + std::sqrt(det)));
                };

                auto var_out = [n, sb2, sg2](double c) {
                    double nc = n - c;
                    return (nc / n) * (sb2 - nc * sg2);
                };

                return (std::min)(var_out(1), var_out((std::min)(c_max(0.), c_max(mg_min)))) / sb2;
            }